

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::MakeNamedMedium
          (ParsedScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  FileLoc *in_RDX;
  ParsedParameterVector *in_RDI;
  AnimatedTransform renderFromMedium;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffff708;
  Tuple2<pbrt::Point2,_float> TVar2;
  ParameterDictionary *in_stack_fffffffffffff710;
  Tuple2<pbrt::Point2,_float> this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff718;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff720;
  char (*in_stack_fffffffffffff740) [16];
  char *in_stack_fffffffffffff748;
  key_type *__k;
  RGBColorSpace *colorSpace;
  ParsedParameterVector *in_stack_fffffffffffff768;
  ParameterDictionary *in_stack_fffffffffffff770;
  int in_stack_fffffffffffff79c;
  ParsedScene *in_stack_fffffffffffff7a0;
  AnimatedTransform *in_stack_fffffffffffff7d8;
  ParameterDictionary *in_stack_fffffffffffff7e0;
  string *in_stack_fffffffffffff7e8;
  TransformedSceneEntity *in_stack_fffffffffffff7f0;
  FileLoc in_stack_fffffffffffff800;
  Float in_stack_fffffffffffffc74;
  Transform *in_stack_fffffffffffffc78;
  Float in_stack_fffffffffffffc84;
  Transform *in_stack_fffffffffffffc88;
  AnimatedTransform *in_stack_fffffffffffffc90;
  _Self local_100;
  _Self local_f8 [3];
  key_type local_e0 [7];
  
  colorSpace = (RGBColorSpace *)&stack0x00000008;
  if (*(int *)((long)&in_RDI[0x16].field_2 + 0x10) == 2) {
    Error<char_const(&)[16]>(in_RDX,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
  }
  else {
    bVar1 = TransformSet::IsAnimated((TransformSet *)in_stack_fffffffffffff718);
    if (bVar1) {
      Warning<char_const(&)[16]>(in_RDX,in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    }
    __k = local_e0;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    ParameterDictionary::ParameterDictionary
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_RDI,colorSpace);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&in_stack_fffffffffffff710->params);
    local_f8[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                 *)in_stack_fffffffffffff708,(key_type *)0x43f9e7);
    local_100._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                *)in_stack_fffffffffffff708);
    bVar1 = std::operator!=(local_f8,&local_100);
    if (bVar1) {
      SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                ((SceneRepresentation *)in_stack_fffffffffffff720,
                 (FileLoc *)in_stack_fffffffffffff718,(char *)in_stack_fffffffffffff710,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff708);
    }
    else {
      GetCTM(in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
      GetCTM(in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
      AnimatedTransform::AnimatedTransform
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                 in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
      ParameterDictionary::ParameterDictionary(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      TVar2 = (colorSpace->r).super_Tuple2<pbrt::Point2,_float>;
      this_00 = (colorSpace->g).super_Tuple2<pbrt::Point2,_float>;
      TransformedSceneEntity::TransformedSceneEntity
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7d8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                    *)in_RDX,__k);
      TransformedSceneEntity::operator=
                ((TransformedSceneEntity *)this_00,(TransformedSceneEntity *)TVar2);
      TransformedSceneEntity::~TransformedSceneEntity((TransformedSceneEntity *)0x43fbbe);
      ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x43fbc8);
    }
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x43fbe0);
  }
  return;
}

Assistant:

void ParsedScene::MakeNamedMedium(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    VERIFY_INITIALIZED("MakeNamedMedium");
    WARN_IF_ANIMATED_TRANSFORM("MakeNamedMedium");
    ParameterDictionary dict(std::move(params), graphicsState->mediumAttributes,
                             graphicsState->colorSpace);

    if (media.find(name) != media.end()) {
        ErrorExitDeferred(&loc, "Named medium \"%s\" redefined.", name);
        return;
    }

    AnimatedTransform renderFromMedium(GetCTM(0), transformStartTime, GetCTM(1),
                                       transformEndTime);

    media[name] = TransformedSceneEntity(name, std::move(dict), loc, renderFromMedium);
}